

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

void argo::utf8::parse_unicode(string *src,size_t *src_index,string *dst,size_t *dst_index)

{
  size_t sVar1;
  pointer pcVar2;
  byte bVar3;
  char32_t cVar4;
  char32_t cVar5;
  json_utf8_exception *this;
  
  sVar1 = *src_index;
  if (((src->_M_string_length < sVar1 + 10) ||
      (pcVar2 = (src->_M_dataplus)._M_p, pcVar2[sVar1 + 4] != '\\')) || (pcVar2[sVar1 + 5] != 'u'))
  {
    cVar4 = parse_hex(src,src_index);
  }
  else {
    cVar4 = parse_hex(src,src_index);
    next_char(src,src_index);
    next_char(src,src_index);
    cVar5 = parse_hex(src,src_index);
    cVar4 = (cVar5 + L'\xffff2400' | cVar4 * 0x400 + 0xfca00000U) + L'𐀀';
  }
  if (((uint)cVar4 < 0x110000) && ((cVar4 & 0x1ff800U) != 0xd800)) {
    if ((uint)cVar4 < 0x80) {
      sVar1 = *dst_index;
      *dst_index = sVar1 + 1;
      (dst->_M_dataplus)._M_p[sVar1] = (byte)cVar4;
      return;
    }
    if ((uint)cVar4 < 0x800) {
      bVar3 = (byte)((uint)cVar4 >> 6) | 0xc0;
    }
    else {
      if ((uint)cVar4 < 0x10000) {
        bVar3 = (byte)((uint)cVar4 >> 0xc) | 0xe0;
      }
      else {
        set_and_check_unicode_byte(dst,dst_index,(byte)((uint)cVar4 >> 0x12) | 0xf0);
        bVar3 = (byte)((uint)cVar4 >> 0xc) & 0x3f | 0x80;
      }
      set_and_check_unicode_byte(dst,dst_index,bVar3);
      bVar3 = (byte)((uint)cVar4 >> 6) & 0x3f | 0x80;
    }
    set_and_check_unicode_byte(dst,dst_index,bVar3);
    set_and_check_unicode_byte(dst,dst_index,(byte)cVar4 & 0x3f | 0x80);
    return;
  }
  this = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
  json_utf8_exception::json_utf8_exception(this,invalid_unicode_e,cVar4);
  __cxa_throw(this,&json_utf8_exception::typeinfo,std::exception::~exception);
}

Assistant:

void utf8::parse_unicode(
                const string &src, 
                size_t       &src_index, 
                string       &dst,
                size_t       &dst_index)
{
    char32_t uc = 0;

    // is this basic multilingual or a UTF-16 surrogate pair?
    if ((src_index + 10) <= src.size() && 
        src[src_index + 4] == '\\' &&
        src[src_index + 5] == 'u')
    {
        char32_t high_surrogate = parse_hex(src, src_index);

        (void)next_char(src, src_index);
        (void)next_char(src, src_index);

        char32_t low_surrogate = parse_hex(src, src_index);

        uc = ((high_surrogate - 0xD800) << 10 | (low_surrogate - 0xDC00)) + 0x10000;
    }
    else
    {
        uc = parse_hex(src, src_index);
    }

    // I would use the nice new C++11 standard conversion templates for this but
    // they're not fully supported by compilers in the wild just yet.

    if (valid_unicode(uc))
    {
        if (uc < 0x80)
        {
            dst[dst_index++] = static_cast<char>(uc);
        }
        else if (uc < 0x800) 
        {
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc >> 6) | 0xc0));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc & 0x3f) | 0x80));
        }
        else if (uc < 0x10000) 
        {
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc >> 12) | 0xe0));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>(((uc >> 6) & 0x3f) | 0x80));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc & 0x3f) | 0x80));
        }
        else 
        {
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc >> 18) | 0xf0));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>(((uc >> 12) & 0x3f) | 0x80));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>(((uc >> 6) & 0x3f) | 0x80));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc & 0x3f) | 0x80));
        }
    }
    else
    {
        throw json_utf8_exception(json_utf8_exception::invalid_unicode_e, uc);
    }
}